

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_13::NameApplier::BeginTryTableExpr(NameApplier *this,TryTableExpr *expr)

{
  pointer pTVar1;
  Result RVar2;
  Var *in_RCX;
  TableCatch *catch_;
  pointer pTVar3;
  string_view sVar4;
  string_view name;
  
  pTVar3 = (expr->catches).super__Vector_base<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pTVar1 = (expr->catches).super__Vector_base<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (pTVar3 == pTVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->labels_,&(expr->block).label);
      return (Result)Ok;
    }
    if (((pTVar3->kind & ~CatchRef) != CatchAll) &&
       (RVar2 = UseNameForTagVar(this,&pTVar3->tag), RVar2.enum_ == Error)) break;
    sVar4 = FindLabelByVar(this,&pTVar3->target);
    name._M_str = (char *)&pTVar3->target;
    name._M_len = (size_t)sVar4._M_str;
    UseNameForVar((NameApplier *)sVar4._M_len,name,in_RCX);
    pTVar3 = pTVar3 + 1;
  }
  return (Result)Error;
}

Assistant:

Result NameApplier::BeginTryTableExpr(TryTableExpr* expr) {
  for (TableCatch& catch_ : expr->catches) {
    if (!catch_.IsCatchAll()) {
      CHECK_RESULT(UseNameForTagVar(&catch_.tag));
    }
    std::string_view label = FindLabelByVar(&catch_.target);
    UseNameForVar(label, &catch_.target);
  }
  PushLabel(expr->block.label);
  return Result::Ok;
}